

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool do_ppzi_flags(DisasContext_conflict1 *s,arg_rpri_esz *a,gen_helper_gvec_flags_3 *gen_fn)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  uint32_t val;
  TCGv_i32 t;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  uintptr_t o;
  
  if (gen_fn != (gen_helper_gvec_flags_3 *)0x0) {
    tcg_ctx = s->uc->tcg_ctx;
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      val = simd_desc_aarch64(s->sve_len,s->sve_len,a->imm);
      t = tcg_const_i32_aarch64(tcg_ctx,val);
      ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
      ts_00 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
      ts_01 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
      tcg_gen_addi_i64_aarch64
                (tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
                 (long)(a->rd * 0x20 + 0x2c10));
      tcg_gen_addi_i64_aarch64
                (tcg_ctx,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
                 (long)(a->rn * 0x100 + 0xc10));
      tcg_gen_addi_i64_aarch64
                (tcg_ctx,(TCGv_i64)((long)ts_01 - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
                 (long)(a->pg * 0x20 + 0x2c10));
      (*gen_fn)(tcg_ctx,t,(TCGv_ptr)((long)ts - (long)tcg_ctx),
                (TCGv_ptr)((long)ts_00 - (long)tcg_ctx),(TCGv_ptr)((long)ts_01 - (long)tcg_ctx),t);
      tcg_temp_free_internal_aarch64(tcg_ctx,ts);
      tcg_temp_free_internal_aarch64(tcg_ctx,ts_00);
      tcg_temp_free_internal_aarch64(tcg_ctx,ts_01);
      do_pred_flags(tcg_ctx,t);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
    }
  }
  return gen_fn != (gen_helper_gvec_flags_3 *)0x0;
}

Assistant:

static bool do_ppzi_flags(DisasContext *s, arg_rpri_esz *a,
                          gen_helper_gvec_flags_3 *gen_fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr pd, zn, pg;
    unsigned vsz;
    TCGv_i32 t;

    if (gen_fn == NULL) {
        return false;
    }
    if (!sve_access_check(s)) {
        return true;
    }

    vsz = vec_full_reg_size(s);
    t = tcg_const_i32(tcg_ctx, simd_desc(vsz, vsz, a->imm));
    pd = tcg_temp_new_ptr(tcg_ctx);
    zn = tcg_temp_new_ptr(tcg_ctx);
    pg = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, pd, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rd));
    tcg_gen_addi_ptr(tcg_ctx, zn, tcg_ctx->cpu_env, vec_full_reg_offset(s, a->rn));
    tcg_gen_addi_ptr(tcg_ctx, pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->pg));

    gen_fn(tcg_ctx, t, pd, zn, pg, t);

    tcg_temp_free_ptr(tcg_ctx, pd);
    tcg_temp_free_ptr(tcg_ctx, zn);
    tcg_temp_free_ptr(tcg_ctx, pg);

    do_pred_flags(tcg_ctx, t);

    tcg_temp_free_i32(tcg_ctx, t);
    return true;
}